

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall mp::NLFeeder_Easy::PermuteVars(NLFeeder_Easy *this)

{
  int *piVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  int *piVar5;
  pointer ppVar6;
  uint uVar7;
  long lVar8;
  size_type __n;
  bool bVar9;
  reference rVar10;
  
  pdVar3 = (this->nlme_).vars_.lower_;
  pdVar4 = (this->nlme_).vars_.upper_;
  piVar5 = (this->nlme_).vars_.type_;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            (&this->var_perm_,(long)(this->nlme_).vars_.num_col_);
  __n = (long)(this->var_perm_).
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(this->var_perm_).
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start >> 3;
  while (__n = __n - 1, __n != 0xffffffffffffffff) {
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->nlv_obj_,__n);
    uVar7 = (uint)((rVar10._M_mask & *rVar10._M_p) != 0) * -2;
    ppVar6 = (this->var_perm_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar6[__n].first = uVar7;
    ppVar6[__n].second = (int)__n;
    if ((piVar5 != (int *)0x0) && (piVar5[__n] != 0)) {
      ppVar6[__n].first = uVar7 | 1;
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->nlv_obj_,__n);
      if ((*rVar10._M_p & rVar10._M_mask) == 0) {
        dVar2 = pdVar3[__n];
        if ((((dVar2 != 0.0) || (NAN(dVar2))) || (dVar2 = pdVar4[__n], dVar2 != 1.0)) ||
           (NAN(dVar2))) {
          ppVar6 = (this->var_perm_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + __n;
          ppVar6->first = ppVar6->first + 1;
          piVar1 = &(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                    num_linear_integer_vars;
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = &(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_linear_binary_vars
          ;
          *piVar1 = *piVar1 + 1;
        }
      }
      else {
        piVar1 = &(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.
                  num_nl_integer_vars_in_objs;
        *piVar1 = *piVar1 + 1;
      }
    }
  }
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->var_perm_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->var_perm_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish);
  ppVar6 = (this->var_perm_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)(this->var_perm_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppVar6 >> 3;
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    ppVar6[ppVar6[lVar8].second].first = (int)lVar8;
  }
  return;
}

Assistant:

void PermuteVars() {
    auto vars = NLME().ColData();
    var_perm_.resize(NLME().NumCols());
    assert(nlv_obj_.size());               // was filled
    for (auto i=var_perm_.size(); i--; ) {
      var_perm_[i] = {-2*(int)nlv_obj_[i], i};  // Prioritize nonlinear
      if (vars.type_ && vars.type_[i]) {        // int var
        ++var_perm_[i].first;
        if (nlv_obj_[i])
          ++header_.num_nl_integer_vars_in_objs; // STATS
        else {
          if (0.0!=std::fabs(vars.lower_[i]) || 1.0!=vars.upper_[i]) {
            ++var_perm_[i].first;           // For linear, first binary
            ++header_.num_linear_integer_vars;   // STATS
          } else
            ++header_.num_linear_binary_vars;    // STATS
        }
      }
    }
    // Could just shove apart in linear time @todo
    std::stable_sort(var_perm_.begin(), var_perm_.end());
    // Create reverse mapping
    for (auto i=var_perm_.size(); i--; )
      var_perm_[var_perm_[i].second].first = i;
  }